

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_textedit_move_to_word_next(nk_text_edit *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int idx;
  
  iVar1 = (state->string).len;
  idx = state->cursor;
  do {
    iVar3 = idx;
    idx = iVar3 + 1;
    if (iVar1 <= idx) break;
    iVar2 = nk_is_word_boundary(state,idx);
  } while (iVar2 == 0);
  if (iVar1 <= iVar3) {
    idx = iVar1;
  }
  return idx;
}

Assistant:

NK_INTERN int
nk_textedit_move_to_word_next(struct nk_text_edit *state)
{
   const int len = state->string.len;
   int c = state->cursor+1;
   while( c < len && !nk_is_word_boundary(state, c))
      ++c;

   if( c > len )
      c = len;

   return c;
}